

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void Liby::Signal::reset(int signo)

{
  _Hash_node_base *p_Var1;
  mapped_type *pp_Var2;
  _Node_iterator_base<std::pair<const_int,_std::function<void_()>_>,_false> __it;
  int in_EDI;
  __node_base_ptr p_Var3;
  __node_base_ptr p_Var4;
  _Node_iterator_base<std::pair<const_int,_void_(*)(int)>,_false> __it_00;
  int local_1c;
  
  p_Var3 = functors._M_h._M_buckets[(ulong)(long)in_EDI % functors._M_h._M_bucket_count];
  p_Var4 = (__node_base_ptr)0x0;
  if ((p_Var3 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var3->_M_nxt, p_Var4 = p_Var3, *(int *)&p_Var3->_M_nxt[1]._M_nxt != in_EDI)) {
    while (p_Var3 = p_Var1, p_Var1 = p_Var3->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var4 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var1[1]._M_nxt % functors._M_h._M_bucket_count !=
           (ulong)(long)in_EDI % functors._M_h._M_bucket_count) ||
         (p_Var4 = p_Var3, *(int *)&p_Var1[1]._M_nxt == in_EDI)) goto LAB_0010a182;
    }
    p_Var4 = (__node_base_ptr)0x0;
  }
LAB_0010a182:
  if (p_Var4 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var4->_M_nxt;
  }
  local_1c = in_EDI;
  if (__it._M_cur != (__node_type *)0x0) {
    std::
    _Hashtable<int,_std::pair<const_int,_std::function<void_()>_>,_std::allocator<std::pair<const_int,_std::function<void_()>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&functors._M_h,(const_iterator)__it._M_cur);
  }
  p_Var3 = stored_funcs._M_h._M_buckets[(ulong)(long)local_1c % stored_funcs._M_h._M_bucket_count];
  p_Var4 = (__node_base_ptr)0x0;
  if ((p_Var3 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var3->_M_nxt, p_Var4 = p_Var3, local_1c != *(int *)&p_Var3->_M_nxt[1]._M_nxt)) {
    while (p_Var3 = p_Var1, p_Var1 = p_Var3->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var4 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var1[1]._M_nxt % stored_funcs._M_h._M_bucket_count !=
           (ulong)(long)local_1c % stored_funcs._M_h._M_bucket_count) ||
         (p_Var4 = p_Var3, local_1c == *(int *)&p_Var1[1]._M_nxt)) goto LAB_0010a203;
    }
    p_Var4 = (__node_base_ptr)0x0;
  }
LAB_0010a203:
  if (p_Var4 == (__node_base_ptr)0x0) {
    __it_00._M_cur = (__node_type *)0x0;
  }
  else {
    __it_00._M_cur = (__node_type *)p_Var4->_M_nxt;
  }
  if (__it_00._M_cur != (__node_type *)0x0) {
    pp_Var2 = std::__detail::
              _Map_base<int,_std::pair<const_int,_void_(*)(int)>,_std::allocator<std::pair<const_int,_void_(*)(int)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_void_(*)(int)>,_std::allocator<std::pair<const_int,_void_(*)(int)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&stored_funcs,&local_1c);
    ::signal(local_1c,(__sighandler_t)*pp_Var2);
    std::
    _Hashtable<int,_std::pair<const_int,_void_(*)(int)>,_std::allocator<std::pair<const_int,_void_(*)(int)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&stored_funcs._M_h,(const_iterator)__it_00._M_cur);
  }
  return;
}

Assistant:

void Signal::reset(int signo) {
    auto k = functors.find(signo);
    if (k != functors.end()) {
        functors.erase(k);
    }
    auto k1 = stored_funcs.find(signo);
    if (k1 != stored_funcs.end()) {
        ::signal(signo, stored_funcs[signo]);
        stored_funcs.erase(k1);
    }
}